

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O1

void __thiscall
ParseNodeProg::ParseNodeProg(ParseNodeProg *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  (this->super_ParseNodeFnc).super_ParseNode.nop = nop;
  (this->super_ParseNodeFnc).super_ParseNode.grfpn = 0;
  (this->super_ParseNodeFnc).super_ParseNode.location = 0xffffffff;
  (this->super_ParseNodeFnc).super_ParseNode.field_0x1 =
       ((this->super_ParseNodeFnc).super_ParseNode.field_0x1 & 0xe0) + 1;
  (this->super_ParseNodeFnc).super_ParseNode.ichMin = ichMin;
  (this->super_ParseNodeFnc).super_ParseNode.ichLim = ichLim;
  (this->super_ParseNodeFnc).fncFlags = kFunctionNone;
  (this->super_ParseNodeFnc).pnodeNext = (ParseNodePtr)0x0;
  (this->super_ParseNodeFnc).pnodeName = (ParseNodeVar *)0x0;
  (this->super_ParseNodeFnc).pid = (IdentPtr)0x0;
  (this->super_ParseNodeFnc).hint = (LPCOLESTR)0x0;
  (this->super_ParseNodeFnc).hintLength = 0;
  (this->super_ParseNodeFnc).hintOffset = 0;
  (this->super_ParseNodeFnc).isNameIdentifierRef = true;
  (this->super_ParseNodeFnc).nestedFuncEscapes = false;
  (this->super_ParseNodeFnc).canBeDeferred = false;
  (this->super_ParseNodeFnc).isBodyAndParamScopeMerged = true;
  (this->super_ParseNodeFnc).pnodeScopes = (ParseNodeBlock *)0x0;
  (this->super_ParseNodeFnc).pnodeBodyScope = (ParseNodeBlock *)0x0;
  (this->super_ParseNodeFnc).pnodeParams = (ParseNodePtr)0x0;
  (this->super_ParseNodeFnc).pnodeVars = (ParseNodePtr)0x0;
  (this->super_ParseNodeFnc).pnodeBody = (ParseNodePtr)0x0;
  (this->super_ParseNodeFnc).pnodeRest = (ParseNodePtr)0x0;
  (this->super_ParseNodeFnc).funcInfo = (FuncInfo *)0x0;
  (this->super_ParseNodeFnc).scope = (Scope *)0x0;
  (this->super_ParseNodeFnc).nestedCount = 0;
  (this->super_ParseNodeFnc).nestedIndex = 0xffffffff;
  (this->super_ParseNodeFnc).firstDefaultArg = 0;
  *(undefined4 *)((long)&(this->super_ParseNodeFnc).cbStringMin + 4) = 0;
  *(undefined8 *)&(this->super_ParseNodeFnc).astSize = 0;
  *(undefined8 *)((long)&(this->super_ParseNodeFnc).cbMin + 4) = 0;
  (this->super_ParseNodeFnc).cbLim = 0;
  (this->super_ParseNodeFnc).lineNumber = 0;
  (this->super_ParseNodeFnc).columnNumber = 0;
  (this->super_ParseNodeFnc).functionId = 0;
  (this->super_ParseNodeFnc).deferredParseNextFunctionId = 0xffffffff;
  (this->super_ParseNodeFnc).superRestrictionState = Disallowed;
  (this->super_ParseNodeFnc).pRestorePoint = (RestorePoint *)0x0;
  (this->super_ParseNodeFnc).deferredStub = (DeferredFunctionStub *)0x0;
  (this->super_ParseNodeFnc).capturedNames = (IdentPtrSet *)0x0;
  this->pnodeLastValStmt = (ParseNodePtr)0x0;
  this->m_UsesArgumentsAtGlobal = false;
  return;
}

Assistant:

ParseNodeProg::ParseNodeProg(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeFnc(nop, ichMin, ichLim)
{
    this->pnodeLastValStmt = nullptr;
    this->m_UsesArgumentsAtGlobal = false;
}